

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

int __thiscall crnlib::rg_etc1::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  color_quad_u8 *pcVar2;
  uint uVar3;
  uint *puVar4;
  results *in_RDX;
  long lVar5;
  uint i;
  uint32 (*pIndices0) [8];
  float fVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar11;
  undefined1 auVar10 [16];
  vec3F local_50;
  vec3F local_40;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  this->m_limit = ((byte)ctx[0x18] ^ 1) << 4 | 0xf;
  local_40.m_s[0] = 0.0;
  local_40.m_s[1] = 0.0;
  local_40.m_s[2] = 0.0;
  pIndices0 = this->m_sorted_luma;
  for (lVar5 = -8; lVar5 != 0; lVar5 = lVar5 + 1) {
    pcVar2 = this->m_pParams->m_pSrc_pixels;
    local_50.m_s[2] = (float)pcVar2[lVar5 + 8].field_0.field_0.b;
    local_50.m_s[0] = (float)(pcVar2[lVar5 + 8].field_0.m_u32 & 0xff);
    local_50.m_s[1] = (float)(pcVar2[lVar5 + 8].field_0.m_u32 >> 8 & 0xff);
    vec3F::operator+=(&local_40,&local_50);
    *(ushort *)((long)this->m_sorted_luma[0] + lVar5 * 2) =
         (ushort)pcVar2[lVar5 + 8].field_0.field_0.b +
         (ushort)pcVar2[lVar5 + 8].field_0.field_0.g + (ushort)pcVar2[lVar5 + 8].field_0.field_0.r;
    this->m_sorted_luma[1][lVar5] = (int)lVar5 + 8;
  }
  vec3F::operator*=(&local_40,0.125);
  *(undefined8 *)(this->m_avg_color).m_s = local_40.m_s._0_8_;
  (this->m_avg_color).m_s[2] = local_40.m_s[2];
  uVar3 = this->m_limit;
  fVar6 = (float)(int)uVar3;
  uVar1 = *(undefined8 *)(this->m_avg_color).m_s;
  auVar10._0_4_ = fVar6 * (float)uVar1;
  auVar10._4_4_ = fVar6 * (float)((ulong)uVar1 >> 0x20);
  auVar10._8_4_ = fVar6 * 0.0;
  auVar10._12_4_ = fVar6 * 0.0;
  auVar10 = divps(auVar10,_DAT_0018cee0);
  fVar9 = auVar10._0_4_ + 0.5;
  fVar11 = auVar10._4_4_ + 0.5;
  uVar7 = (uint)fVar9;
  uVar8 = (uint)fVar11;
  uVar7 = (int)(fVar9 - 2.1474836e+09) & (int)uVar7 >> 0x1f | uVar7;
  uVar8 = (int)(fVar11 - 2.1474836e+09) & (int)uVar8 >> 0x1f | uVar8;
  this->m_br = ~-(uint)((int)uVar7 < 0) &
               (~-(uint)((int)uVar7 < (int)uVar3) & uVar3 | uVar7 & -(uint)((int)uVar7 < (int)uVar3)
               );
  this->m_bg = ~-(uint)((int)uVar8 < 0) &
               (~-(uint)((int)uVar8 < (int)uVar3) & uVar3 | uVar8 & -(uint)((int)uVar8 < (int)uVar3)
               );
  uVar7 = (uint)(long)((fVar6 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar7 < (int)uVar3) {
    uVar3 = uVar7;
  }
  uVar8 = 0;
  if (-1 < (int)uVar7) {
    uVar8 = uVar3;
  }
  this->m_bb = uVar8;
  if ((int)(this->m_pParams->super_etc1_pack_params).m_quality < 2) {
    lVar5 = 0;
    puVar4 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (8,*pIndices0,this->m_sorted_luma[1],this->m_luma,0,2,false);
    this->m_pSorted_luma_indices = puVar4;
    if ((uint32 (*) [8])puVar4 == pIndices0) {
      pIndices0 = this->m_sorted_luma + 1;
    }
    this->m_pSorted_luma = *pIndices0;
    for (; lVar5 != 8; lVar5 = lVar5 + 1) {
      (*pIndices0)[lVar5] = (uint)this->m_luma[puVar4[lVar5]];
    }
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& p, results& r)
        {
            // This version is hardcoded for 8 pixel subblocks.
            RG_ETC1_ASSERT(p.m_num_src_pixels == 8);

            m_pParams = &p;
            m_pResult = &r;

            const uint n = 8;

            m_limit = m_pParams->m_use_color4 ? 15 : 31;

            vec3F avg_color(0.0f);

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
                const vec3F fc(c.r, c.g, c.b);

                avg_color += fc;

                m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
                m_sorted_luma[0][i] = i;
            }
            avg_color *= (1.0f / static_cast<float>(n));
            m_avg_color = avg_color;

            m_br = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bg = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bb = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

            if (m_pParams->m_quality <= cMediumQuality)
            {
                m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0], m_sorted_luma[1], m_luma, 0, sizeof(m_luma[0]), false);
                m_pSorted_luma = m_sorted_luma[0];
                if (m_pSorted_luma_indices == m_sorted_luma[0])
                {
                    m_pSorted_luma = m_sorted_luma[1];
                }

                for (uint i = 0; i < n; i++)
                {
                    m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
                }
            }

            m_best_solution.m_coords.clear();
            m_best_solution.m_valid = false;
            m_best_solution.m_error = cUINT64_MAX;
        }